

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O2

void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx,uchar *seed32)

{
  undefined4 extraout_EAX;
  size_t outlen;
  size_t outlen_00;
  int iVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  secp256k1_scalar diff;
  uchar local_1a8 [40];
  secp256k1_scalar local_180;
  secp256k1_fe f;
  secp256k1_gej gb;
  uchar local_b8 [32];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  secp256k1_rfc6979_hmac_sha256 local_74;
  
  secp256k1_scalar_half((secp256k1_scalar *)&gb,&secp256k1_scalar_one);
  secp256k1_scalar_negate((secp256k1_scalar *)&gb,(secp256k1_scalar *)&gb);
  diff.d[2] = 0;
  diff.d[3] = 0;
  diff.d[0] = 1;
  diff.d[1] = 0;
  iVar1 = 0x101;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    secp256k1_scalar_add(&diff,&diff,&diff);
  }
  secp256k1_scalar_add(&diff,&diff,(secp256k1_scalar *)&gb);
  if (seed32 == (uchar *)0x0) {
    secp256k1_ge_neg(&ctx->ge_offset,&secp256k1_ge_const_g);
    secp256k1_scalar_add(&ctx->scalar_offset,&secp256k1_scalar_one,&diff);
    (ctx->proj_blind).n[2] = 0;
    (ctx->proj_blind).n[3] = 0;
    (ctx->proj_blind).n[0] = 1;
    (ctx->proj_blind).n[1] = 0;
    (ctx->proj_blind).n[4] = 0;
  }
  else {
    secp256k1_scalar_get_b32(local_b8,&ctx->scalar_offset);
    local_98 = *(undefined8 *)seed32;
    uStack_90 = *(undefined8 *)(seed32 + 8);
    local_88 = *(undefined8 *)(seed32 + 0x10);
    uStack_80 = *(undefined8 *)(seed32 + 0x18);
    secp256k1_rfc6979_hmac_sha256_initialize(&local_74,local_b8,0x40);
    secp256k1_rfc6979_hmac_sha256_generate(&local_74,local_1a8,outlen);
    secp256k1_fe_impl_set_b32_mod(&f,local_1a8);
    iVar1 = secp256k1_fe_impl_normalizes_to_zero(&f);
    secp256k1_fe_impl_cmov(&f,&secp256k1_fe_one,iVar1);
    (ctx->proj_blind).n[4] = f.n[4];
    (ctx->proj_blind).n[2] = f.n[2];
    (ctx->proj_blind).n[3] = f.n[3];
    (ctx->proj_blind).n[0] = f.n[0];
    (ctx->proj_blind).n[1] = f.n[1];
    secp256k1_rfc6979_hmac_sha256_generate(&local_74,local_1a8,outlen_00);
    secp256k1_scalar_set_b32(&local_180,local_1a8,(int *)0x0);
    auVar3._0_4_ = -(uint)((int)local_180.d[2] == 0 && (int)local_180.d[0] == 0);
    auVar3._4_4_ = -(uint)(local_180.d[2]._4_4_ == 0 && local_180.d[0]._4_4_ == 0);
    auVar3._8_4_ = -(uint)((int)local_180.d[3] == 0 && (int)local_180.d[1] == 0);
    auVar3._12_4_ = -(uint)(local_180.d[3]._4_4_ == 0 && local_180.d[1]._4_4_ == 0);
    iVar1 = movmskps(extraout_EAX,auVar3);
    secp256k1_scalar_cmov(&local_180,&secp256k1_scalar_one,(uint)(iVar1 == 0xf));
    secp256k1_ecmult_gen(ctx,&gb,&local_180);
    secp256k1_scalar_negate(&local_180,&local_180);
    secp256k1_scalar_add(&ctx->scalar_offset,&local_180,&diff);
    secp256k1_ge_set_gej(&ctx->ge_offset,&gb);
    secp256k1_gej_clear(&gb);
    secp256k1_fe_impl_clear(&f);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx, const unsigned char *seed32) {
    secp256k1_scalar b;
    secp256k1_scalar diff;
    secp256k1_gej gb;
    secp256k1_fe f;
    unsigned char nonce32[32];
    secp256k1_rfc6979_hmac_sha256 rng;
    unsigned char keydata[64];

    /* Compute the (2^COMB_BITS - 1)/2 term once. */
    secp256k1_ecmult_gen_scalar_diff(&diff);

    if (seed32 == NULL) {
        /* When seed is NULL, reset the final point and blinding value. */
        secp256k1_ge_neg(&ctx->ge_offset, &secp256k1_ge_const_g);
        secp256k1_scalar_add(&ctx->scalar_offset, &secp256k1_scalar_one, &diff);
        ctx->proj_blind = secp256k1_fe_one;
        return;
    }
    /* The prior blinding value (if not reset) is chained forward by including it in the hash. */
    secp256k1_scalar_get_b32(keydata, &ctx->scalar_offset);
    /** Using a CSPRNG allows a failure free interface, avoids needing large amounts of random data,
     *   and guards against weak or adversarial seeds.  This is a simpler and safer interface than
     *   asking the caller for blinding values directly and expecting them to retry on failure.
     */
    VERIFY_CHECK(seed32 != NULL);
    memcpy(keydata + 32, seed32, 32);
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, 64);
    memset(keydata, 0, sizeof(keydata));

    /* Compute projective blinding factor (cannot be 0). */
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_fe_set_b32_mod(&f, nonce32);
    secp256k1_fe_cmov(&f, &secp256k1_fe_one, secp256k1_fe_normalizes_to_zero(&f));
    ctx->proj_blind = f;

    /* For a random blinding value b, set scalar_offset=diff-b, ge_offset=bG */
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_scalar_set_b32(&b, nonce32, NULL);
    /* The blinding value cannot be zero, as that would mean ge_offset = infinity,
     * which secp256k1_gej_add_ge cannot handle. */
    secp256k1_scalar_cmov(&b, &secp256k1_scalar_one, secp256k1_scalar_is_zero(&b));
    secp256k1_rfc6979_hmac_sha256_finalize(&rng);
    memset(nonce32, 0, 32);
    secp256k1_ecmult_gen(ctx, &gb, &b);
    secp256k1_scalar_negate(&b, &b);
    secp256k1_scalar_add(&ctx->scalar_offset, &b, &diff);
    secp256k1_ge_set_gej(&ctx->ge_offset, &gb);

    /* Clean up. */
    secp256k1_scalar_clear(&b);
    secp256k1_gej_clear(&gb);
    secp256k1_fe_clear(&f);
}